

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlAttrNormalizeSpace(xmlChar *src,xmlChar *dst)

{
  xmlChar *local_20;
  xmlChar *dst_local;
  xmlChar *src_local;
  
  if ((src == (xmlChar *)0x0) || (dst_local = src, dst == (xmlChar *)0x0)) {
    src_local = (xmlChar *)0x0;
  }
  else {
    for (; local_20 = dst, *dst_local == ' '; dst_local = dst_local + 1) {
    }
    while (*dst_local != '\0') {
      if (*dst_local == ' ') {
        for (; *dst_local == ' '; dst_local = dst_local + 1) {
        }
        if (*dst_local != '\0') {
          *local_20 = ' ';
          local_20 = local_20 + 1;
        }
      }
      else {
        *local_20 = *dst_local;
        local_20 = local_20 + 1;
        dst_local = dst_local + 1;
      }
    }
    *local_20 = '\0';
    if (local_20 == dst_local) {
      src_local = (xmlChar *)0x0;
    }
    else {
      src_local = local_20;
    }
  }
  return src_local;
}

Assistant:

static xmlChar *
xmlAttrNormalizeSpace(const xmlChar *src, xmlChar *dst)
{
    if ((src == NULL) || (dst == NULL))
        return(NULL);

    while (*src == 0x20) src++;
    while (*src != 0) {
	if (*src == 0x20) {
	    while (*src == 0x20) src++;
	    if (*src != 0)
		*dst++ = 0x20;
	} else {
	    *dst++ = *src++;
	}
    }
    *dst = 0;
    if (dst == src)
       return(NULL);
    return(dst);
}